

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O3

int solution(set<int,_std::less<int>,_std::allocator<int>_> *nodes,
            map<int,_std::__cxx11::list<int,_std::allocator<int>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::__cxx11::list<int,_std::allocator<int>_>_>_>_>
            *inc,map<int,_std::__cxx11::list<int,_std::allocator<int>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::__cxx11::list<int,_std::allocator<int>_>_>_>_>
                 *r_inc)

{
  long *__k;
  int iVar1;
  undefined8 *puVar2;
  undefined8 *puVar3;
  _Self __tmp_2;
  _List_node_base *p_Var4;
  mapped_type *pmVar5;
  _Base_ptr p_Var6;
  long *plVar7;
  mapped_type *__x;
  mapped_type *pmVar8;
  _Rb_tree_node_base *p_Var9;
  int iVar10;
  _Self __tmp;
  int iVar11;
  size_t *this;
  undefined1 auVar12 [8];
  _Rb_tree_header *p_Var13;
  undefined1 local_a8 [8];
  map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_> n;
  list<int,_std::allocator<int>_> l;
  undefined1 local_50 [8];
  list<int,_std::allocator<int>_> starts;
  
  n._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)&n;
  n._M_t._M_impl._0_4_ = 0;
  n._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  n._M_t._M_impl.super__Rb_tree_header._M_header._4_4_ = 0;
  n._M_t._M_impl.super__Rb_tree_header._M_header._M_right = (_Base_ptr)0x0;
  local_50 = (undefined1  [8])local_50;
  starts.super__List_base<int,_std::allocator<int>_>._M_impl._M_node.super__List_node_base._M_prev =
       (_List_node_base *)0x0;
  p_Var6 = (nodes->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left;
  p_Var13 = &(nodes->_M_t)._M_impl.super__Rb_tree_header;
  n._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       n._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
  starts.super__List_base<int,_std::allocator<int>_>._M_impl._M_node.super__List_node_base._M_next =
       (_List_node_base *)local_50;
  if ((_Rb_tree_header *)p_Var6 != p_Var13) {
    do {
      p_Var9 = p_Var6 + 1;
      p_Var4 = (_List_node_base *)
               std::
               map<int,_std::__cxx11::list<int,_std::allocator<int>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::__cxx11::list<int,_std::allocator<int>_>_>_>_>
               ::operator[](r_inc,(key_type *)p_Var9);
      if ((((_List_base<int,_std::allocator<int>_> *)&p_Var4->_M_next)->_M_impl)._M_node.
          super__List_node_base._M_next == p_Var4) {
        p_Var4 = (_List_node_base *)operator_new(0x18);
        *(_Rb_tree_color *)&p_Var4[1]._M_next = p_Var9->_M_color;
        std::__detail::_List_node_base::_M_hook(p_Var4);
        starts.super__List_base<int,_std::allocator<int>_>._M_impl._M_node.super__List_node_base.
        _M_prev = (_List_node_base *)
                  ((long)&(starts.super__List_base<int,_std::allocator<int>_>._M_impl._M_node.
                           super__List_node_base._M_prev)->_M_next + 1);
        pmVar5 = std::map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>::
                 operator[]((map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>
                             *)local_a8,(key_type *)p_Var9);
        *pmVar5 = 1;
      }
      p_Var6 = (_Base_ptr)std::_Rb_tree_increment(p_Var6);
    } while ((_Rb_tree_header *)p_Var6 != p_Var13);
    auVar12 = local_50;
    if ((undefined1  [8])local_50 != local_50) {
      do {
        this = &n._M_t._M_impl.super__Rb_tree_header._M_node_count;
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"process ",8);
        plVar7 = (long *)std::ostream::operator<<
                                   ((ostream *)&std::cerr,
                                    *(int *)&((_List_node_base *)((long)auVar12 + 0x10))->_M_next);
        std::ios::widen((char)*(undefined8 *)(*plVar7 + -0x18) + (char)plVar7);
        std::ostream::put((char)plVar7);
        std::ostream::flush();
        starts.super__List_base<int,_std::allocator<int>_>._M_impl._M_node._M_size = (size_t)auVar12
        ;
        __x = std::
              map<int,_std::__cxx11::list<int,_std::allocator<int>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::__cxx11::list<int,_std::allocator<int>_>_>_>_>
              ::operator[](inc,(key_type *)((long)auVar12 + 0x10));
        std::__cxx11::list<int,_std::allocator<int>_>::list
                  ((list<int,_std::allocator<int>_> *)this,__x);
        plVar7 = (long *)n._M_t._M_impl.super__Rb_tree_header._M_node_count;
        if ((size_t *)n._M_t._M_impl.super__Rb_tree_header._M_node_count != this) {
          do {
            __k = plVar7 + 2;
            pmVar5 = std::map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>
                     ::operator[]((map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>
                                   *)local_a8,(key_type *)__k);
            if (*pmVar5 == 0) {
              p_Var4 = (_List_node_base *)operator_new(0x18);
              *(key_type *)&p_Var4[1]._M_next = (key_type)*__k;
              std::__detail::_List_node_base::_M_hook(p_Var4);
              starts.super__List_base<int,_std::allocator<int>_>._M_impl._M_node.
              super__List_node_base._M_prev =
                   (_List_node_base *)
                   ((long)&(starts.super__List_base<int,_std::allocator<int>_>._M_impl._M_node.
                            super__List_node_base._M_prev)->_M_next + 1);
            }
            pmVar5 = std::map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>
                     ::operator[]((map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>
                                   *)local_a8,(key_type *)__k);
            pmVar8 = std::map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>
                     ::operator[]((map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>
                                   *)local_a8,(key_type *)((long)auVar12 + 0x10));
            iVar10 = *pmVar8;
            iVar1 = *pmVar5;
            pmVar5 = std::map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>
                     ::operator[]((map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>
                                   *)local_a8,(key_type *)__k);
            iVar11 = iVar10 + 1;
            if (iVar10 + 1 < iVar1) {
              iVar11 = iVar1;
            }
            *pmVar5 = iVar11;
            plVar7 = (long *)*plVar7;
          } while ((size_t *)plVar7 != &n._M_t._M_impl.super__Rb_tree_header._M_node_count);
        }
        starts.super__List_base<int,_std::allocator<int>_>._M_impl._M_node._M_size =
             *(size_t *)starts.super__List_base<int,_std::allocator<int>_>._M_impl._M_node._M_size;
        p_Var9 = n._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
        puVar3 = (undefined8 *)n._M_t._M_impl.super__Rb_tree_header._M_node_count;
        while (n._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = p_Var9,
              puVar3 != &n._M_t._M_impl.super__Rb_tree_header._M_node_count) {
          puVar2 = (undefined8 *)*puVar3;
          operator_delete(puVar3,0x18);
          p_Var9 = n._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
          puVar3 = puVar2;
        }
        auVar12 = (undefined1  [8])
                  starts.super__List_base<int,_std::allocator<int>_>._M_impl._M_node._M_size;
      } while ((_List_node_base *)local_50 !=
               (_List_node_base *)
               starts.super__List_base<int,_std::allocator<int>_>._M_impl._M_node._M_size);
      iVar10 = 0;
      for (; p_Var9 != (_Rb_tree_node_base *)&n;
          p_Var9 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var9)) {
        if (iVar10 < *(int *)&p_Var9[1].field_0x4) {
          iVar10 = *(int *)&p_Var9[1].field_0x4;
        }
      }
      auVar12 = local_50;
      while (auVar12 != (undefined1  [8])local_50) {
        p_Var4 = ((_List_node_base *)auVar12)->_M_next;
        operator_delete((void *)auVar12,0x18);
        auVar12 = (undefined1  [8])p_Var4;
      }
      std::
      _Rb_tree<int,_std::pair<const_int,_int>,_std::_Select1st<std::pair<const_int,_int>_>,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>
      ::~_Rb_tree((_Rb_tree<int,_std::pair<const_int,_int>,_std::_Select1st<std::pair<const_int,_int>_>,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>
                   *)local_a8);
      return iVar10;
    }
  }
  __assert_fail("starts.end() != k",
                "/workspace/llm4binary/github/license_all_cmakelists_25/kvirund[P]codingame/medium/dwarfs/main.cpp"
                ,0x20,
                "int solution(std::set<int> &, std::map<int, std::list<int>> &, std::map<int, std::list<int>> &)"
               );
}

Assistant:

int solution(std::set<int>& nodes, std::map<int, std::list<int> >& inc, std::map<int, std::list<int> >& r_inc)
{
    std::map<int, int> n;
    std::list<int> starts;
    
    for (std::set<int>::const_iterator i = nodes.begin(); i != nodes.end(); i++)
    {
        if (r_inc[*i].empty())
        {
            starts.push_back(*i);
            n[*i] = 1;
        }
    }
    
    std::list<int>::const_iterator k = starts.begin();
    assert(starts.end() != k);
    while (starts.end() != k)
    {
        cerr << "process " << *k << endl;
        std::list<int> l = inc[*k];
        for (std::list<int>::const_iterator j = l.begin(); j != l.end(); j++)
        {
            if (0 == n[*j])
            {
                starts.push_back(*j);
            }
            n[*j] = std::max(n[*j], n[*k] + 1);
        }
        k++;
    }
    
    int max = 0;
    for (std::map<int, int>::const_iterator i = n.begin(); i != n.end(); i++)
    {
        if (i->second > max)
        {
            max = i->second;
        }
    }
    return max;
}